

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_unittest.h
# Opt level: O0

void __thiscall
google::protobuf::internal::gtest_suite_WireFormatTest_::
ParseBrokenMessageSet<proto2_unittest::TestAllTypes>::TestBody
          (ParseBrokenMessageSet<proto2_unittest::TestAllTypes> *this)

{
  bool bVar1;
  char *message;
  char *in_R9;
  string local_d0;
  AssertHelper local_b0;
  Message local_a8;
  string_view local_a0;
  bool local_89;
  undefined1 local_88 [8];
  AssertionResult gtest_ar_;
  allocator<char> local_61;
  string local_60 [8];
  string input;
  TestMessageSet message_set;
  ParseBrokenMessageSet<proto2_unittest::TestAllTypes> *this_local;
  
  proto2_wireformat_unittest::TestMessageSet::TestMessageSet
            ((TestMessageSet *)((long)&input.field_2 + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_60,"goodbye",&local_61);
  std::allocator<char>::~allocator(&local_61);
  local_a0 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view(local_60);
  bVar1 = protobuf::MessageLite::ParseFromString((MessageLite *)((long)&input.field_2 + 8),local_a0)
  ;
  local_89 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_88,&local_89,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_88);
  if (!bVar1) {
    testing::Message::Message(&local_a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_d0,(internal *)local_88,
               (AssertionResult *)"message_set.ParseFromString(input)","true","false",in_R9);
    message = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format_unittest.h"
               ,0x357,message);
    testing::internal::AssertHelper::operator=(&local_b0,&local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_b0);
    std::__cxx11::string::~string((string *)&local_d0);
    testing::Message::~Message(&local_a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_88);
  std::__cxx11::string::~string(local_60);
  proto2_wireformat_unittest::TestMessageSet::~TestMessageSet
            ((TestMessageSet *)((long)&input.field_2 + 8));
  return;
}

Assistant:

TYPED_TEST_P(WireFormatTest, ParseBrokenMessageSet) {
  typename TestFixture::TestMessageSet message_set;
  std::string input("goodbye");  // Invalid wire format data.
  EXPECT_FALSE(message_set.ParseFromString(input));
}